

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutil.h
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* FastPForLib::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *__return_storage_ptr__,string *str,string *del)

{
  ulong uVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = std::__cxx11::string::find_first_not_of((char *)str,(ulong)(del->_M_dataplus)._M_p,0);
  uVar2 = std::__cxx11::string::find_first_of((char *)str,(ulong)(del->_M_dataplus)._M_p,uVar1);
  if ((uVar2 & uVar1) != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar1 = std::__cxx11::string::find_first_not_of
                        ((char *)str,(ulong)(del->_M_dataplus)._M_p,uVar2);
      uVar2 = std::__cxx11::string::find_first_of((char *)str,(ulong)(del->_M_dataplus)._M_p,uVar1);
    } while ((uVar2 & uVar1) != 0xffffffffffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> split(const std::string &str, const std::string &del) {
  std::vector<std::string> tokens;
  size_t lastPos = str.find_first_not_of(del, 0);
  size_t pos = str.find_first_of(del, lastPos);
  while (std::string::npos != pos || std::string::npos != lastPos) {
    tokens.push_back(str.substr(lastPos, pos - lastPos));
    lastPos = str.find_first_not_of(del, pos);
    pos = str.find_first_of(del, lastPos);
  }
  return tokens;
}